

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_> __thiscall
kj::anon_unknown_59::InMemoryDirectory::asFile
          (InMemoryDirectory *this,
          Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *lock,EntryImpl *entry)

{
  bool bVar1;
  Own<const_kj::File,_std::nullptr_t> *this_00;
  File *__fn;
  SymlinkNode *this_01;
  int __flags;
  long in_RCX;
  void *__child_stack;
  ReadableFile *extraout_RDX;
  ReadableFile *extraout_RDX_00;
  ReadableFile *extraout_RDX_01;
  ReadableFile *pRVar2;
  void *in_R8;
  Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_> MVar3;
  PathPtr path;
  Fault local_78;
  Fault f;
  undefined1 local_60 [8];
  Path newPath;
  Own<const_kj::File,_std::nullptr_t> local_38;
  long local_28;
  EntryImpl *entry_local;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *lock_local;
  InMemoryDirectory *this_local;
  
  local_28 = in_RCX;
  entry_local = entry;
  lock_local = lock;
  this_local = this;
  bVar1 = OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          ::is<kj::(anonymous_namespace)::InMemoryDirectory::FileNode>
                    ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                      *)(in_RCX + 0x18));
  __flags = (int)in_RCX;
  if (bVar1) {
    this_00 = &OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
               ::get<kj::(anonymous_namespace)::InMemoryDirectory::FileNode>
                         ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                           *)(local_28 + 0x18))->file;
    __fn = Own<const_kj::File,_std::nullptr_t>::operator->(this_00);
    File::clone((File *)&local_38,(__fn *)__fn,__child_stack,__flags,in_R8);
    Maybe<kj::Own<kj::ReadableFile_const,decltype(nullptr)>>::Maybe<kj::File_const>
              ((Maybe<kj::Own<kj::ReadableFile_const,decltype(nullptr)>> *)this,&local_38);
    Own<const_kj::File,_std::nullptr_t>::~Own(&local_38);
    pRVar2 = extraout_RDX;
  }
  else {
    bVar1 = OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
            ::is<kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                      ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                        *)(local_28 + 0x18));
    if (bVar1) {
      this_01 = OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                ::get<kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                          ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                            *)(local_28 + 0x18));
      SymlinkNode::parse((Path *)local_60,this_01);
      Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::release
                ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)entry_local);
      PathPtr::PathPtr((PathPtr *)&f,(Path *)local_60);
      path.parts.size_ = (size_t)f.exception;
      path.parts.ptr = (String *)lock;
      tryOpenFile(this,path);
      Path::~Path((Path *)local_60);
      pRVar2 = extraout_RDX_00;
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[11]>
                (&local_78,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x695,FAILED,(char *)0x0,"\"not a file\"",(char (*) [11])"not a file");
      Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_>::Maybe
                ((Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_> *)this);
      kj::_::Debug::Fault::~Fault(&local_78);
      pRVar2 = extraout_RDX_01;
    }
  }
  MVar3.ptr.ptr = pRVar2;
  MVar3.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_>)MVar3.ptr;
}

Assistant:

Maybe<Own<const ReadableFile>> asFile(
      kj::Locked<const Impl>& lock, const EntryImpl& entry) const {
    if (entry.node.is<FileNode>()) {
      return entry.node.get<FileNode>().file->clone();
    } else if (entry.node.is<SymlinkNode>()) {
      auto newPath = entry.node.get<SymlinkNode>().parse();
      lock.release();
      return tryOpenFile(newPath);
    } else {
      KJ_FAIL_REQUIRE("not a file") { return kj::none; }
    }
  }